

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

TStatus luaD_closeprotected(lua_State *L,ptrdiff_t level,TStatus status)

{
  lu_byte lVar1;
  CallInfo *pCVar2;
  CloseP pcl;
  long local_40;
  TStatus local_38;
  
  pCVar2 = L->ci;
  lVar1 = L->allowhook;
  while( true ) {
    local_40 = (long)(L->stack).p + level;
    local_38 = status;
    status = luaD_rawrunprotected(L,closepaux,&local_40);
    if (status == '\0') break;
    L->ci = pCVar2;
    L->allowhook = lVar1;
  }
  return local_38;
}

Assistant:

TStatus luaD_closeprotected (lua_State *L, ptrdiff_t level, TStatus status) {
  CallInfo *old_ci = L->ci;
  lu_byte old_allowhooks = L->allowhook;
  for (;;) {  /* keep closing upvalues until no more errors */
    struct CloseP pcl;
    pcl.level = restorestack(L, level); pcl.status = status;
    status = luaD_rawrunprotected(L, &closepaux, &pcl);
    if (l_likely(status == LUA_OK))  /* no more errors? */
      return pcl.status;
    else {  /* an error occurred; restore saved state and repeat */
      L->ci = old_ci;
      L->allowhook = old_allowhooks;
    }
  }
}